

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstar.cpp
# Opt level: O1

bool __thiscall
GMAA_MAAstar::ConstructAndValuateNextPolicies
          (GMAA_MAAstar *this,PartialPolicyPoolItemInterface_sharedPtr *ppi,
          PartialPolicyPoolInterface_sharedPtr *poolOfNextPolicies,bool *cleanUpPPI)

{
  long lVar1;
  size_t *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  double dVar4;
  size_t sVar5;
  size_t sVar6;
  QFunctionJAOHInterface *q;
  BGIP_SolverCreatorInterface *pBVar7;
  element_type *peVar8;
  DecPOMDPDiscreteInterface *pDVar9;
  element_type *peVar10;
  double dVar11;
  undefined1 auVar12 [16];
  PartialPolicyPoolItemInterface_sharedPtr *pPVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  shared_count sVar16;
  char cVar17;
  bool bVar18;
  int iVar19;
  Index IVar20;
  undefined8 *puVar21;
  BayesianGameForDecPOMDPStage *this_00;
  BayesianGameIdenticalPayoffSolver *p;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LIndex i;
  ostream *poVar22;
  TimedAlgorithm *pTVar23;
  uint agI;
  ulong uVar24;
  PartialPolicyPoolInterface_sharedPtr *r1;
  double dVar25;
  PartialPolicyPoolInterface_sharedPtr *pPVar26;
  undefined1 in_XMM2 [16];
  PJPDP_sharedPtr jpolPrevTs;
  JPPV_sharedPtr bgpol;
  shared_ptr<JointPolicyDiscretePure> jpdp;
  double val;
  vector<unsigned_int,_std::allocator<unsigned_int>_> firstOHtsI;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_428;
  shared_count sStack_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_418;
  shared_count sStack_410;
  shared_ptr<const_PartialJointPolicyDiscretePure> local_408;
  element_type *local_3f8;
  shared_count sStack_3f0;
  PartialPolicyPoolItemInterface_sharedPtr *local_3e8;
  TimedAlgorithm *local_3e0;
  element_type *local_3d8;
  shared_count sStack_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c8;
  shared_count sStack_3c0;
  shared_ptr<BayesianGameIdenticalPayoffSolver> local_3b8;
  PartialPolicyPoolInterface_sharedPtr *local_3a8;
  undefined8 uStack_3a0;
  shared_ptr<JointPolicyDiscretePure> local_398;
  double local_380;
  bool *local_378;
  undefined1 local_370 [8];
  shared_count local_368;
  double local_360;
  undefined1 local_358 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348 [24];
  long local_1c8;
  shared_count sStack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  shared_count sStack_1b0;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_3a8 = poolOfNextPolicies;
  local_378 = cleanUpPPI;
  (*ppi->px->_vptr_PartialPolicyPoolItemInterface[2])(&local_3f8);
  sVar5 = (local_3f8->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
          _m_depth;
  sVar6 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
          super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
          _m_horizon;
  local_418 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  sStack_410.pi_ = (sp_counted_base *)0x0;
  sStack_420.pi_ = (sp_counted_base *)0x0;
  local_3b8.px = (element_type *)0x0;
  local_3b8.pn.pi_ = (sp_counted_base *)0x0;
  (*ppi->px->_vptr_PartialPolicyPoolItemInterface[5])(&local_1b8);
  pTVar23 = (TimedAlgorithm *)(sVar6 - 1);
  boost::detail::shared_count::~shared_count(&sStack_1b0);
  iVar19 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
           super_GeneralizedMAAStarPlanner._m_verboseness;
  if (local_1b8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    if (7 < iVar19) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"GMAA_MAAstar: I have not expanded this ppi before...",0x34);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
    }
    this_00 = (BayesianGameForDecPOMDPStage *)operator_new(0x150);
    q = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete)._m_qHeuristic;
    local_408.px = local_3f8;
    local_408.pn.pi_ = sStack_3f0.pi_;
    if (sStack_3f0.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (sStack_3f0.pi_)->use_count_ = (sStack_3f0.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_3e0 = pTVar23;
    BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
              (this_00,(PlanningUnitDecPOMDPDiscrete *)this,q,&local_408);
    boost::shared_ptr<BayesianGameForDecPOMDPStage>::shared_ptr<BayesianGameForDecPOMDPStage>
              ((shared_ptr<BayesianGameForDecPOMDPStage> *)local_358,this_00);
    uVar15 = local_358._8_8_;
    uVar14 = local_358._0_8_;
    sStack_1b0.pi_ = sStack_410.pi_;
    local_1b8 = local_418;
    local_358._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_358._8_8_ = (sp_counted_base *)0x0;
    local_418 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)uVar14;
    sStack_410.pi_ = (sp_counted_base *)uVar15;
    boost::detail::shared_count::~shared_count(&sStack_1b0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&((string *)local_358)->_M_string_length);
    boost::detail::shared_count::~shared_count(&local_408.pn);
    psVar2 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
              super_GeneralizedMAAStarPlanner._m_bgCounter;
    *psVar2 = *psVar2 + 1;
    iVar19 = std::__cxx11::string::compare
                       ((char *)&(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                                 super_GeneralizedMAAStarPlanner._m_bgBaseFilename);
    if (iVar19 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_1a8,
                           (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                           super_GeneralizedMAAStarPlanner._m_bgBaseFilename._M_dataplus._M_p,
                           (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                           super_GeneralizedMAAStarPlanner._m_bgBaseFilename._M_string_length);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
      paVar3 = local_418;
      std::__cxx11::stringbuf::str();
      BayesianGameIdenticalPayoff::Save
                ((BayesianGameIdenticalPayoff *)(paVar3->_M_local_buf + 0x20),(string *)local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._0_8_ != &((string *)local_358)->field_2) {
        operator_delete((void *)local_358._0_8_,local_348[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    pBVar7 = this->_m_newBGIP_Solver;
    local_408.px = (element_type *)(local_418->_M_local_buf + 0x20);
    if (local_418 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      local_408.px = (element_type *)0x0;
    }
    local_408.pn.pi_ = sStack_410.pi_;
    if (sStack_410.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (sStack_410.pi_)->use_count_ = (sStack_410.pi_)->use_count_ + 1;
      UNLOCK();
    }
    p = (BayesianGameIdenticalPayoffSolver *)
        (**(code **)(*(long *)pBVar7 + 0x10))(pBVar7,&local_408);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::
    shared_ptr<BayesianGameIdenticalPayoffSolver>
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)local_358,p);
    uVar15 = local_358._8_8_;
    uVar14 = local_358._0_8_;
    sStack_1b0.pi_ = local_3b8.pn.pi_;
    local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8.px;
    local_358._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_358._8_8_ = (sp_counted_base *)0x0;
    local_3b8.px = (element_type *)uVar14;
    local_3b8.pn.pi_ = (sp_counted_base *)uVar15;
    boost::detail::shared_count::~shared_count(&sStack_1b0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&((string *)local_358)->_M_string_length);
    boost::detail::shared_count::~shared_count(&local_408.pn);
    boost::dynamic_pointer_cast<BGIP_IncrementalSolverInterface,BayesianGameIdenticalPayoffSolver>
              ((boost *)local_358,&local_3b8);
    uVar14 = local_358._8_8_;
    local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._0_8_;
    sStack_1b0.pi_ = sStack_420.pi_;
    local_358._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_358._8_8_ = (sp_counted_base *)0x0;
    sStack_420.pi_ = (sp_counted_base *)uVar14;
    local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    boost::detail::shared_count::~shared_count(&sStack_1b0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&((string *)local_358)->_M_string_length);
    pTVar23 = local_3e0;
    if (local_428 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if ((TimedAlgorithm *)sVar5 == local_3e0) {
        BGIPSolution::SetNrDesiredSolutions((BGIPSolution *)(local_428->_M_local_buf + 0x18),1);
        if (3 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                super_GeneralizedMAAStarPlanner._m_verboseness) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Last stage - set nr solutions to 1",0x22);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
          std::ostream::put(-0x50);
          std::ostream::flush();
        }
      }
      else if (*(long *)(local_428->_M_local_buf + 0x30) != 0x7fffffff) {
        puVar21 = (undefined8 *)__cxa_allocate_exception(0x28);
        *puVar21 = &PTR__E_0059bd80;
        puVar21[1] = puVar21 + 3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(puVar21 + 1),
                   "GMAA_MAAstar requires a BGIP solver to return all solutions (when requested)",""
                  );
        goto LAB_003cf103;
      }
      peVar8 = ppi->px;
      local_1b8 = local_428;
      sStack_1b0.pi_ = sStack_420.pi_;
      if (sStack_420.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (sStack_420.pi_)->use_count_ = (sStack_420.pi_)->use_count_ + 1;
        UNLOCK();
      }
      (*peVar8->_vptr_PartialPolicyPoolItemInterface[7])(peVar8,&local_1b8);
      boost::detail::shared_count::~shared_count(&sStack_1b0);
LAB_003cea69:
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"GMAA_MAAstar::NextExact_ts",0x1a);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      local_3e0 = &(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                   super_GeneralizedMAAStarPlanner.super_TimedAlgorithm;
      TimedAlgorithm::StartTimer(local_3e0,(string *)local_358);
      paVar3 = &((string *)local_358)->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._0_8_ != paVar3) {
        operator_delete((void *)local_358._0_8_,local_348[0]._M_allocated_capacity + 1);
      }
      GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetCBGbounds
                (&this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete,ppi,&local_3b8);
      local_398.px = (element_type *)0x0;
      local_398.pn.pi_ = (sp_counted_base *)0x0;
      *(long *)(local_428->_M_local_buf + 0x108) = *(long *)(local_428->_M_local_buf + 0x108) + 1;
      cVar17 = (**(code **)(local_428->_M_allocated_capacity + 0x50))
                         (local_428,&local_398,&local_360);
      if (cVar17 == '\0') {
        if (0 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                super_GeneralizedMAAStarPlanner._m_verboseness) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "GMAA_MAAstar no valid solution returned by the Incremental BGIP Solver",0x46);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
          std::ostream::put(-0x50);
          std::ostream::flush();
        }
        (*ppi->px->_vptr_PartialPolicyPoolItemInterface[4])(0xffefffffffffffff);
      }
      else {
        boost::dynamic_pointer_cast<JointPolicyPureVector,JointPolicyDiscretePure>
                  ((boost *)&local_3c8,&local_398);
        if (local_3c8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          puVar21 = (undefined8 *)__cxa_allocate_exception(0x28);
          *puVar21 = &PTR__E_0059bd80;
          puVar21[1] = puVar21 + 3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(puVar21 + 1),
                     "GMAA_MAAstar we did not get a valid policy from the incremental BGIP solver",
                     "");
          __cxa_throw(puVar21,&E::typeinfo,E::~E);
        }
        local_3d8 = (element_type *)0x0;
        sStack_3d0.pi_ = (sp_counted_base *)0x0;
        iVar19 = (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                   super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.
                   super_PlanningUnit._vptr_PlanningUnit[6])(this);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_358,
                   CONCAT44(extraout_var,iVar19),(allocator_type *)&local_408);
        agI = 0;
        while( true ) {
          iVar19 = (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                     super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.
                     super_PlanningUnit._vptr_PlanningUnit[6])(this);
          uVar24 = (ulong)agI;
          if (CONCAT44(extraout_var_00,iVar19) <= uVar24) break;
          i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                        ((PlanningUnitMADPDiscrete *)this,agI,(Index)sVar5);
          IVar20 = Globals::CastLIndexToIndex(i);
          if ((ulong)((long)(local_358._8_8_ - local_358._0_8_) >> 2) <= uVar24) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar24);
          }
          *(Index *)(local_358._0_8_ + uVar24 * 4) = IVar20;
          agI = agI + 1;
        }
        (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
          super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
          _vptr_PlanningUnit[0x18])
                  (&local_1c8,this,local_3f8,local_3c8,local_418->_M_local_buf + 0xb8,
                   (string *)local_358);
        sVar16.pi_ = sStack_1c0.pi_;
        lVar1 = local_1c8;
        local_408.pn.pi_ = sStack_3d0.pi_;
        local_408.px = local_3d8;
        local_1c8 = 0;
        sStack_1c0.pi_ = (sp_counted_base *)0x0;
        local_3d8 = (element_type *)lVar1;
        sStack_3d0.pi_ = sVar16.pi_;
        boost::detail::shared_count::~shared_count(&local_408.pn);
        boost::detail::shared_count::~shared_count(&sStack_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_358._0_8_,
                          local_348[0]._M_allocated_capacity - local_358._0_8_);
        }
        pDVar9 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                 super_PlanningUnitDecPOMDPDiscrete._m_DecPOMDP;
        dVar25 = (double)(**(code **)(*(long *)((long)&pDVar9->field_0x0 +
                                               *(long *)(*(long *)pDVar9 + -0xb0)) + 0x70))
                                   ((long)&pDVar9->field_0x0 + *(long *)(*(long *)pDVar9 + -0xb0));
        auVar12 = vcvtusi2sd_avx512f(in_XMM2,sVar5);
        local_3e8 = ppi;
        dVar25 = pow(dVar25,auVar12._0_8_);
        local_358._0_8_ = local_3c8;
        local_358._8_8_ = sStack_3c0.pi_;
        if (sStack_3c0.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (sStack_3c0.pi_)->use_count_ = (sStack_3c0.pi_)->use_count_ + 1;
          UNLOCK();
        }
        local_380 = (double)(**(code **)(local_418->_M_allocated_capacity + 0x28))
                                      (local_418,(string *)local_358,0);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&((string *)local_358)->_M_string_length);
        dVar4 = (local_3f8->super_PartialJointPolicy)._m_pastReward;
        dVar11 = dVar4 + local_380;
        *(double *)((long)local_3d8 + 0x38) = dVar11;
        r1 = (PartialPolicyPoolInterface_sharedPtr *)
             ((ulong)((TimedAlgorithm *)sVar5 == pTVar23) * (long)dVar11 +
             (ulong)((TimedAlgorithm *)sVar5 != pTVar23) * (long)(dVar4 + dVar25 * local_360));
        peVar10 = local_3a8->px;
        uStack_3a0 = 0;
        local_3a8 = r1;
        (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
          super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.super_PlanningUnit.
          _vptr_PlanningUnit[0x16])(local_370,this);
        (*peVar10->_vptr_PartialPolicyPoolInterface[8])(peVar10,local_370);
        boost::detail::shared_count::~shared_count(&local_368);
        pPVar13 = local_3e8;
        if (sVar5 != 0) {
          (*local_3e8->px->_vptr_PartialPolicyPoolItemInterface[3])();
          (*pPVar13->px->_vptr_PartialPolicyPoolItemInterface[4])(local_3a8);
          pDVar9 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                   super_PlanningUnitDecPOMDPDiscrete._m_DecPOMDP;
          dVar25 = (double)(**(code **)(*(long *)((long)&pDVar9->field_0x0 +
                                                 *(long *)(*(long *)pDVar9 + -0xb0)) + 0x70))
                                     ((long)&pDVar9->field_0x0 + *(long *)(*(long *)pDVar9 + -0xb0))
          ;
          if ((dVar25 == 1.0) && (!NAN(dVar25))) {
            (*pPVar13->px->_vptr_PartialPolicyPoolItemInterface[3])();
            if ((double)r1 < dVar25) {
              (*pPVar13->px->_vptr_PartialPolicyPoolItemInterface[3])();
              bVar18 = Globals::EqualReward((double)r1,dVar25);
              if (!bVar18) {
                std::__cxx11::stringstream::stringstream((stringstream *)local_358);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&((string *)local_358)->field_2,
                           "GMAA_MAAstar value of parent can only go down when being updated: old value="
                           ,0x4c);
                pPVar26 = r1;
                poVar22 = std::ostream::_M_insert<double>((double)r1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar22," new value=",0xb);
                (*local_3e8->px->_vptr_PartialPolicyPoolItemInterface[3])();
                poVar22 = std::ostream::_M_insert<double>((double)pPVar26);
                std::__ostream_insert<char,std::char_traits<char>>(poVar22," old-new=",9);
                (*local_3e8->px->_vptr_PartialPolicyPoolItemInterface[3])();
                std::ostream::_M_insert<double>((double)r1 - (double)pPVar26);
                puVar21 = (undefined8 *)__cxa_allocate_exception(0x28);
                *puVar21 = &PTR__E_0059bd80;
                std::__cxx11::stringbuf::str();
                __cxa_throw(puVar21,&E::typeinfo,E::~E);
              }
            }
          }
        }
        boost::detail::shared_count::~shared_count(&sStack_3d0);
        boost::detail::shared_count::~shared_count(&sStack_3c0);
      }
      bVar18 = BGIP_IncrementalSolverInterface::AllSolutionsHaveBeenReturned
                         ((BGIP_IncrementalSolverInterface *)local_428);
      if (bVar18) {
        bVar18 = true;
        if (3 < (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                super_GeneralizedMAAStarPlanner._m_verboseness) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"AllSolutionsHaveBeenReturned, removing ",0x27);
          (*(local_3f8->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
            _vptr_JointPolicy[6])((string *)local_358);
          poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)local_358._0_8_,local_358._8_8_);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar22 + -0x18) + (char)poVar22);
          std::ostream::put((char)poVar22);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._0_8_ != paVar3) {
            operator_delete((void *)local_358._0_8_,local_348[0]._M_allocated_capacity + 1);
          }
        }
      }
      else {
        bVar18 = false;
      }
      *local_378 = bVar18;
      std::__cxx11::stringbuf::str();
      TimedAlgorithm::StopTimer(local_3e0,(string *)local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._0_8_ != paVar3) {
        operator_delete((void *)local_358._0_8_,local_348[0]._M_allocated_capacity + 1);
      }
      boost::detail::shared_count::~shared_count(&local_398.pn);
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      std::ios_base::~ios_base(local_138);
      boost::detail::shared_count::~shared_count(&local_3b8.pn);
      boost::detail::shared_count::~shared_count(&sStack_420);
      boost::detail::shared_count::~shared_count(&sStack_410);
      boost::detail::shared_count::~shared_count(&sStack_3f0);
      return (TimedAlgorithm *)sVar5 == pTVar23;
    }
    puVar21 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar21 = &PTR__E_0059bd80;
    puVar21[1] = puVar21 + 3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(puVar21 + 1),
               "GMAA_MAAstar requires BGIP_IncrementalSolverInterface solvers","");
  }
  else {
    if (7 < iVar19) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "GMAA_MAAstar: ppi was expanded before, getting the previous BGIPSolver...",0x49);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
    }
    (*ppi->px->_vptr_PartialPolicyPoolItemInterface[5])((string *)local_358);
    uVar15 = local_358._8_8_;
    uVar14 = local_358._0_8_;
    sStack_1b0.pi_ = local_3b8.pn.pi_;
    local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8.px;
    local_358._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_358._8_8_ = (sp_counted_base *)0x0;
    local_3b8.px = (element_type *)uVar14;
    local_3b8.pn.pi_ = (sp_counted_base *)uVar15;
    boost::detail::shared_count::~shared_count(&sStack_1b0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&((string *)local_358)->_M_string_length);
    boost::dynamic_pointer_cast<BGIP_IncrementalSolverInterface,BayesianGameIdenticalPayoffSolver>
              ((boost *)local_358,&local_3b8);
    uVar14 = local_358._8_8_;
    local_428 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._0_8_;
    sStack_1b0.pi_ = sStack_420.pi_;
    local_358._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_358._8_8_ = (sp_counted_base *)0x0;
    sStack_420.pi_ = (sp_counted_base *)uVar14;
    local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    boost::detail::shared_count::~shared_count(&sStack_1b0);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&((string *)local_358)->_M_string_length);
    if (local_428 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      puVar21 = (undefined8 *)__cxa_allocate_exception(0x28);
      *puVar21 = &PTR__E_0059bd80;
      puVar21[1] = puVar21 + 3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(puVar21 + 1),
                 "GMAA_MAAstar requires BGIP_IncrementalSolverInterface solvers","");
    }
    else {
      local_408.px = *(element_type **)(local_428->_M_local_buf + 8);
      local_408.pn.pi_ = *(sp_counted_base **)(local_428->_M_local_buf + 0x10);
      if (*(long *)(local_428->_M_local_buf + 0x10) != 0) {
        LOCK();
        lVar1 = *(long *)(local_428->_M_local_buf + 0x10) + 8;
        *(int *)lVar1 = *(int *)lVar1 + 1;
        UNLOCK();
      }
      boost::
      dynamic_pointer_cast<BayesianGameForDecPOMDPStage_const,BayesianGameIdenticalPayoffInterface_const>
                ((boost *)local_358,
                 (shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)&local_408);
      uVar15 = local_358._8_8_;
      uVar14 = local_358._0_8_;
      sStack_1b0.pi_ = sStack_410.pi_;
      local_1b8 = local_418;
      local_358._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_358._8_8_ = (sp_counted_base *)0x0;
      local_418 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)uVar14;
      sStack_410.pi_ = (sp_counted_base *)uVar15;
      boost::detail::shared_count::~shared_count(&sStack_1b0);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&((string *)local_358)->_M_string_length);
      boost::detail::shared_count::~shared_count(&local_408.pn);
      if (local_418 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_003cea69;
      puVar21 = (undefined8 *)__cxa_allocate_exception(0x28);
      *puVar21 = &PTR__E_0059bd80;
      puVar21[1] = puVar21 + 3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(puVar21 + 1),"GMAA_MAAstar BG is not of the correct type","");
    }
  }
LAB_003cf103:
  __cxa_throw(puVar21,&E::typeinfo,E::~E);
}

Assistant:

bool GMAA_MAAstar::ConstructAndValuateNextPolicies(
        const PartialPolicyPoolItemInterface_sharedPtr &ppi,
        const PartialPolicyPoolInterface_sharedPtr &poolOfNextPolicies,
        bool &cleanUpPPI) 
{
    PJPDP_sharedPtr jpolPrevTs = ppi->GetJPol();//jpol^ts-1
    size_t ts = jpolPrevTs->GetDepth();     // = depth = ts(jpolPrevTs) + 1
    bool is_last_ts = (ts ==  GetHorizon() - 1);

    //the BG pointer
    boost::shared_ptr<const BayesianGameForDecPOMDPStage> bg_ts;
    //the solver pointers
    //boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVector> > bgipIncSolver;
    //boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector> > bgips;
    boost::shared_ptr<BGIP_IncrementalSolverInterface> bgipIncSolver;
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver> bgips;
    // Check whether we already considered this
    // PartialJointPolicyDiscretePure before, in which case the
    // BayesianGameForDecPOMDPStage and the BGIPSolver have already
    // been generated
    if(ppi->GetBGIPSolverPointer()==0)
    {
        if(_m_verboseness >= 8) 
            cout << "GMAA_MAAstar: I have not expanded this ppi before..." << endl;

        // Construct the bayesian game for this timestep - 
        bg_ts= boost::shared_ptr<BayesianGameForDecPOMDPStage> (
            new BayesianGameForDecPOMDPStage(
                this,
                _m_qHeuristic,
                jpolPrevTs
                ));
        // not sure this pays off in terms of time vs space...
//        bg_ts->ComputeAllImmediateRewards();

        // save the BG to disk in case the user requested it
        _m_bgCounter++;
        if(_m_bgBaseFilename!="")
        {
            stringstream ss;
            ss << _m_bgBaseFilename << _m_bgCounter;
            BayesianGameIdenticalPayoff::Save(*bg_ts,ss.str());
        }

        // keep track of every bg_ts we instantiate, so we can clean
        // them up after solving
//        _m_pointersToAllBGTS.push_back(bg_ts);

        //create the Bayesian game solver
        bgips =
            boost::shared_ptr<
            BayesianGameIdenticalPayoffSolver/*_T<JointPolicyPureVector>*/
            >( (*_m_newBGIP_Solver)(bg_ts) );
        bgipIncSolver = boost::dynamic_pointer_cast<
            BGIP_IncrementalSolverInterface/*_T<JointPolicyPureVector>*/ > (bgips);
        if(bgipIncSolver==0)
            throw(E("GMAA_MAAstar requires BGIP_IncrementalSolverInterface solvers"));

        if(is_last_ts)
        {
            //For the last stage we only want 1 solution.
            bgipIncSolver->SetNrDesiredSolutions(1);
            if(_m_verboseness >= 4)
                std::cout << "Last stage - set nr solutions to 1"<<endl;
        }
        else if(bgipIncSolver->GetNrDesiredSolutions()!=INT_MAX)
            throw(E("GMAA_MAAstar requires a BGIP solver to return all solutions (when requested)"));

        // associate the resulting incremental BGIPSolver with this
        // PPI, so that we can reuse it
        ppi->SetBGIPSolverPointer(bgipIncSolver);
    }
    else
    {
        if(_m_verboseness >= 8) 
            cout << "GMAA_MAAstar: ppi was expanded before, getting the previous BGIPSolver..." << endl;
        bgips = ppi->GetBGIPSolverPointer();           
        bgipIncSolver= boost::dynamic_pointer_cast<
            BGIP_IncrementalSolverInterface/*_T<JointPolicyPureVector> */
            > (bgips);
        if(bgipIncSolver==0)
            throw(E("GMAA_MAAstar requires BGIP_IncrementalSolverInterface solvers"));
        bg_ts = boost::dynamic_pointer_cast<const BayesianGameForDecPOMDPStage>(bgipIncSolver->GetBGIPI());
        if(bg_ts==0)
            throw(E("GMAA_MAAstar BG is not of the correct type"));
    }

    stringstream ss;
    ss << "GMAA_MAAstar::NextExact_ts" << ts;
    StartTimer(ss.str());

    // Compute bounds on the value solving this CBG can result in
    this->GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetCBGbounds(ppi,bgips);

    // Ask the BGIPSolver for the next solution, which might not exist
    // due to the bounds on the value of the solution
    double val;
    boost::shared_ptr<JointPolicyDiscretePure> jpdp;
    /// Calling the BGIPSolver
    bool foundCBGsolution = bgipIncSolver->GetNextJointPolicyAndValue(jpdp, val);

    if(foundCBGsolution)
    {
        JPPV_sharedPtr bgpol = boost::dynamic_pointer_cast<JointPolicyPureVector>(jpdp);
        if(bgpol==0)
            throw(E("GMAA_MAAstar we did not get a valid policy from the incremental BGIP solver"));

        //Frans 20110908: what kind of construction is this: 
        PJPDP_sharedPtr jpolTs;
        {
            vector<Index> firstOHtsI(GetNrAgents());
            for(Index agI=0; agI < GetNrAgents(); agI++)
                firstOHtsI.at(agI) = 
                    CastLIndexToIndex(GetFirstObservationHistoryIndex(agI, ts));

            const vector<size_t>& nrOHts = bg_ts->GetNrTypes(); 
            jpolTs = ConstructExtendedJointPolicy(*jpolPrevTs,
                                                  *bgpol,
                                                  nrOHts,
                                                  firstOHtsI);
        }
        //??? why the indented block?!
        
        double discountToThePowerT = pow( GetDiscount(), (double)(ts) );
        double discounted_F = discountToThePowerT * val;
        
        //compute expected immediate reward for this stage
        double immR = bg_ts->ComputeDiscountedImmediateRewardForJPol(bgpol);
        double prevPastReward = jpolPrevTs->GetPastReward();
        double newPastreward = jpolPrevTs->GetPastReward() + immR;
        jpolTs->SetPastReward(newPastreward);
        
        ////if last stage, if so, we want to return the 
        ////*EXACT* past reward, newPastreward.
        double newValue;
        if(is_last_ts)
            newValue = newPastreward;
        else
            newValue = prevPastReward + discounted_F;

        //push this policy and value on the priority queue
        poolOfNextPolicies->Insert( NewPPI(jpolTs,newValue) );

#if DEBUG_GMAA4
        cout <<"v = pastReward_prevTs + g^t * f = "
             << newValue <<" = "
             << jpolPrevTs->GetPastReward() <<" + "
             << discounted_F << "   "
             << "(g^t * f ="<<discountToThePowerT << " * " << val << ")"
             << endl;
#endif

        if(ts>0)
        {
            double oldValue=ppi->GetValue();
            // now we update the current PPI with the value of the next sibling
            // other option is the value of this child
//          ppi->SetValue(bgipIncSolver->GetPayoff());
            ppi->SetValue(newValue);

            if(GetDiscount()==1.0 &&
               oldValue < ppi->GetValue() &&
               !EqualReward(oldValue, ppi->GetValue()))
            {
                stringstream ss;
                ss << "GMAA_MAAstar value of parent can only go down when being updated: old value="
                   << oldValue << " new value=" << ppi->GetValue()
                   << " old-new=" << oldValue-ppi->GetValue();
                throw(E(ss));
            }
        }
    }
    else // we did NOT get a valid solution from this CBG
    {
        if(_m_verboseness >= 1)
            cout << "GMAA_MAAstar no valid solution returned by the Incremental BGIP Solver"<< endl;

        // as we didn't any solution for the CBG, we know this branch
        // of the tree can never contain the optimal policy, so we set
        // its value very low
        ppi->SetValue(-DBL_MAX);
    }
    
    // if we returned all solutions from this BG, it has to be deleted
    // from the policy pool
    if(bgipIncSolver->AllSolutionsHaveBeenReturned())
    {
        if(_m_verboseness >= 4)
            cout << "AllSolutionsHaveBeenReturned, removing " << jpolPrevTs->SoftPrint()
                 << endl;
        cleanUpPPI=true;
    }
    else
        cleanUpPPI=false;

    StopTimer(ss.str());
    //if we created a BG for the last time step t=h-1 - we have a lowerbound
    return(is_last_ts);
}